

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bluetooth_piconet.c
# Opt level: O0

void perm_table_init(void)

{
  int iVar1;
  int local_14;
  int local_10;
  int p_low;
  int p_high;
  int z;
  
  for (p_low = 0; p_low < 0x20; p_low = p_low + 1) {
    for (local_10 = 0; local_10 < 0x20; local_10 = local_10 + 1) {
      for (local_14 = 0; local_14 < 0x200; local_14 = local_14 + 1) {
        iVar1 = perm5(p_low,local_10,local_14);
        perm_table[p_low][local_10][local_14] = (char)iVar1;
      }
    }
  }
  return;
}

Assistant:

void perm_table_init(void)
{
	/* populate perm_table for all possible inputs */
	int z, p_high, p_low;
	for (z = 0; z < 0x20; z++)
		for (p_high = 0; p_high < 0x20; p_high++)
			for (p_low = 0; p_low < 0x200; p_low++)
				perm_table[z][p_high][p_low] = perm5(z, p_high, p_low);
}